

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stop_time.c
# Opt level: O1

timepoint_precision_t parse_timepoint_precision(char *value)

{
  int iVar1;
  timepoint_precision_t tVar2;
  
  iVar1 = strcmp(value,"0");
  if (iVar1 == 0) {
    tVar2 = TP_APPROXIMATE;
  }
  else {
    iVar1 = strcmp(value,"1");
    if (iVar1 == 0) {
      tVar2 = TP_EXACT;
    }
    else {
      tVar2 = TP_NOT_SET - (*value == '\0');
    }
  }
  return tVar2;
}

Assistant:

timepoint_precision_t parse_timepoint_precision(const char *value) {
    if (strcmp(value, "0") == 0)
        return TP_APPROXIMATE;
    else if (strcmp(value, "1") == 0 || strcmp(value, "") == 0)
        return TP_EXACT;
    else
        return TP_NOT_SET;
}